

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void trial::protocol::serialization::
     load_overloader<trial::protocol::json::basic_iarchive<char>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
     ::load(basic_iarchive<char> *ar,variable *data,uint param_3)

{
  basic_variable<std::allocator<char>_> *__return_storage_ptr__;
  undefined1 *data_00;
  basic_variable<std::allocator<char>> *pbVar1;
  bool bVar2;
  value vVar3;
  error *this;
  intmax_t value_00;
  detail *this_00;
  basic_variable<std::allocator<char>_> *local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_variable<std::allocator<char>> *local_310;
  basic_variable<std::allocator<char>_> local_308;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_2a8 [72];
  iterator local_260;
  const_iterator local_248;
  iterator local_230;
  undefined1 local_218 [8];
  variable value_5;
  string key;
  iterator local_190;
  const_iterator local_178;
  iterator local_160;
  undefined1 local_148 [8];
  variable value_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string value_3;
  undefined1 auStack_78 [8];
  longdouble value_2;
  basic_variable<std::allocator<char>_> local_58;
  detail *local_28;
  intmax_t value_1;
  bool value;
  basic_variable<std::allocator<char>> *pbStack_18;
  uint param_2_local;
  variable *data_local;
  basic_iarchive<char> *ar_local;
  
  value_1._4_4_ = param_3;
  pbStack_18 = (basic_variable<std::allocator<char>> *)data;
  data_local = (variable *)ar;
  vVar3 = json::basic_iarchive<char>::symbol(ar);
  switch(vVar3) {
  case null:
    json::basic_iarchive<char>::load<trial::protocol::json::token::null>
              ((basic_iarchive<char> *)data_local);
    dynamic::basic_variable<std::allocator<char>_>::operator=
              ((basic_variable<std::allocator<char>_> *)pbStack_18,null);
    break;
  case boolean:
    value_1._3_1_ = 0;
    json::basic_iarchive<char>::load<bool>
              ((basic_iarchive<char> *)data_local,(bool *)((long)&value_1 + 3));
    dynamic::basic_variable<std::allocator<char>>::operator=(pbStack_18,(bool)(value_1._3_1_ & 1));
    break;
  case integer:
    local_28 = (detail *)0x0;
    json::basic_iarchive<char>::load<long>((basic_iarchive<char> *)data_local,(long *)&local_28);
    json::detail::compact<trial::dynamic::basic_variable<std::allocator<char>>>
              (&local_58,local_28,value_00);
    dynamic::basic_variable<std::allocator<char>_>::operator=
              ((basic_variable<std::allocator<char>_> *)pbStack_18,&local_58);
    dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_58);
    break;
  case real:
    _auStack_78 = (longdouble)0;
    this_00 = (detail *)auStack_78;
    json::basic_iarchive<char>::load<long_double>
              ((basic_iarchive<char> *)data_local,(longdouble *)this_00);
    __return_storage_ptr__ = (basic_variable<std::allocator<char>_> *)((long)&value_3.field_2 + 8);
    json::detail::compact<trial::dynamic::basic_variable<std::allocator<char>>>
              (__return_storage_ptr__,this_00,_auStack_78);
    dynamic::basic_variable<std::allocator<char>_>::operator=
              ((basic_variable<std::allocator<char>_> *)pbStack_18,__return_storage_ptr__);
    dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)((long)&value_3.field_2 + 8));
    break;
  case string:
    std::__cxx11::string::string((string *)local_c8);
    json::basic_iarchive<char>::load<std::__cxx11::string>
              ((basic_iarchive<char> *)data_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
    std::__cxx11::string::string((string *)&local_e8,(string *)local_c8);
    dynamic::basic_variable<std::allocator<char>>::operator=(pbStack_18,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)local_c8);
    break;
  default:
    this = (error *)__cxa_allocate_exception(0x20);
    json::error::error(this,unexpected_token);
    __cxa_throw(this,&json::error::typeinfo,json::error::~error);
  case begin_array:
    json::basic_iarchive<char>::load<trial::protocol::json::token::begin_array>
              ((basic_iarchive<char> *)data_local);
    dynamic::basic_array<std::allocator<char>_>::make();
    dynamic::basic_variable<std::allocator<char>_>::operator=
              ((basic_variable<std::allocator<char>_> *)pbStack_18,
               (basic_variable<std::allocator<char>_> *)&value_4.storage.field_0x28);
    dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)&value_4.storage.field_0x28);
    while (bVar2 = json::basic_iarchive<char>::at<trial::protocol::json::token::end_array>
                             ((basic_iarchive<char> *)data_local), ((bVar2 ^ 0xffU) & 1) != 0) {
      dynamic::basic_variable<std::allocator<char>_>::basic_variable
                ((basic_variable<std::allocator<char>_> *)local_148);
      json::basic_iarchive<char>::
      load_override<trial::dynamic::basic_variable<std::allocator<char>>>
                ((basic_iarchive<char> *)data_local,
                 (basic_variable<std::allocator<char>_> *)local_148);
      pbVar1 = pbStack_18;
      dynamic::basic_variable<std::allocator<char>_>::end
                (&local_190,(basic_variable<std::allocator<char>_> *)pbStack_18);
      dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
                (&local_178,&local_190);
      dynamic::basic_variable<std::allocator<char>_>::insert
                (&local_160,(basic_variable<std::allocator<char>_> *)pbVar1,&local_178,
                 (basic_variable<std::allocator<char>_> *)local_148);
      dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_160);
      dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_178);
      dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_190);
      dynamic::basic_variable<std::allocator<char>_>::~basic_variable
                ((basic_variable<std::allocator<char>_> *)local_148);
    }
    json::basic_iarchive<char>::load<trial::protocol::json::token::end_array>
              ((basic_iarchive<char> *)data_local);
    break;
  case begin_object:
    json::basic_iarchive<char>::load<trial::protocol::json::token::begin_object>
              ((basic_iarchive<char> *)data_local);
    dynamic::basic_map<std::allocator<char>_>::make();
    dynamic::basic_variable<std::allocator<char>_>::operator=
              ((basic_variable<std::allocator<char>_> *)pbStack_18,
               (basic_variable<std::allocator<char>_> *)((long)&key.field_2 + 8));
    dynamic::basic_variable<std::allocator<char>_>::~basic_variable
              ((basic_variable<std::allocator<char>_> *)((long)&key.field_2 + 8));
    while (bVar2 = json::basic_iarchive<char>::at<trial::protocol::json::token::end_object>
                             ((basic_iarchive<char> *)data_local), ((bVar2 ^ 0xffU) & 1) != 0) {
      data_00 = &value_5.storage.field_0x28;
      std::__cxx11::string::string((string *)data_00);
      json::basic_iarchive<char>::load_override<std::__cxx11::string>
                ((basic_iarchive<char> *)data_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)data_00);
      dynamic::basic_variable<std::allocator<char>_>::basic_variable
                ((basic_variable<std::allocator<char>_> *)local_218);
      json::basic_iarchive<char>::
      load_override<trial::dynamic::basic_variable<std::allocator<char>>>
                ((basic_iarchive<char> *)data_local,
                 (basic_variable<std::allocator<char>_> *)local_218);
      pbVar1 = pbStack_18;
      dynamic::basic_variable<std::allocator<char>_>::end
                (&local_260,(basic_variable<std::allocator<char>_> *)pbStack_18);
      dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
                (&local_248,&local_260);
      local_310 = (basic_variable<std::allocator<char>> *)&local_308;
      std::__cxx11::string::string((string *)&local_330,(string *)&value_5.storage.field_0x28);
      dynamic::basic_variable<std::allocator<char>>::basic_variable<std::__cxx11::string>
                ((basic_variable<std::allocator<char>> *)&local_308,&local_330);
      local_310 = (basic_variable<std::allocator<char>> *)&local_2d8;
      dynamic::basic_variable<std::allocator<char>_>::basic_variable
                ((basic_variable<std::allocator<char>_> *)local_310,
                 (basic_variable<std::allocator<char>_> *)local_218);
      local_2a8._0_8_ = &local_308;
      local_2a8._8_8_ = 2;
      dynamic::basic_variable<std::allocator<char>_>::basic_variable
                ((basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10),
                 (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
                 local_2a8);
      dynamic::basic_variable<std::allocator<char>_>::insert
                (&local_230,(basic_variable<std::allocator<char>_> *)pbVar1,&local_248,
                 (basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10));
      dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
      dynamic::basic_variable<std::allocator<char>_>::~basic_variable
                ((basic_variable<std::allocator<char>_> *)(local_2a8 + 0x10));
      local_3a0 = (basic_variable<std::allocator<char>_> *)local_2a8;
      do {
        local_3a0 = local_3a0 + -1;
        dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3a0);
      } while (local_3a0 != &local_308);
      std::__cxx11::string::~string((string *)&local_330);
      dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_248);
      dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
      dynamic::basic_variable<std::allocator<char>_>::~basic_variable
                ((basic_variable<std::allocator<char>_> *)local_218);
      std::__cxx11::string::~string((string *)&value_5.storage.field_0x28);
    }
    json::basic_iarchive<char>::load<trial::protocol::json::token::end_object>
              ((basic_iarchive<char> *)data_local);
  }
  return;
}

Assistant:

static void load(protocol::json::basic_iarchive<CharT>& ar,
                     dynamic::variable& data,
                     const unsigned int /* protocol_version */)
    {
        using namespace trial::protocol::json;
        switch (ar.symbol())
        {
        case token::symbol::null:
            ar.template load<token::null>();
            data = dynamic::null;
            break;

        case token::symbol::boolean:
            {
                bool value = {};
                ar.load(value);
                data = value;
            }
            break;

        case token::symbol::integer:
            {
                std::intmax_t value = {};
                ar.load(value);
                data = json::detail::compact<dynamic::variable>(value);
            }
            break;

        case token::symbol::real:
            {
                long double value = {};
                ar.load(value);
                data = json::detail::compact<dynamic::variable>(value);
            }
            break;

        case token::symbol::string:
            {
                std::string value;
                ar.load(value);
                data = value;
            }
            break;

        case token::symbol::begin_array:
            {
                ar.template load<token::begin_array>();
                data = dynamic::array::make();
                while (!ar.template at<token::end_array>())
                {
                    dynamic::variable value;
                    ar.load_override(value);
                    data.insert(data.end(), value);
                }
                ar.template load<token::end_array>();
            }
            break;

        case token::symbol::begin_object:
            {
                ar.template load<token::begin_object>();
                data = dynamic::map::make();
                while (!ar.template at<token::end_object>())
                {
                    std::string key;
                    ar.load_override(key);
                    dynamic::variable value;
                    ar.load_override(value);
                    data.insert(data.end(), { std::move(key), std::move(value) });
                }
                ar.template load<token::end_object>();
            }
            break;

        default:
            throw json::error(json::errc::unexpected_token);
            break;
        }
    }